

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WorkerJob.h
# Opt level: O0

void __thiscall
xmrig::WorkerJob<4UL>::nextRound(WorkerJob<4UL> *this,uint32_t rounds,uint32_t roundSize)

{
  uint32_t uVar1;
  char *pcVar2;
  uint32_t *puVar3;
  int in_EDX;
  int __c;
  ulong uVar4;
  ulong extraout_RDX;
  char *in_RSI;
  char *__s;
  WorkerJob<4UL> *in_RDI;
  size_t i_1;
  size_t i;
  WorkerJob<4UL> *in_stack_ffffffffffffffe0;
  WorkerJob<4UL> *this_00;
  char *local_18;
  
  __s = in_RSI;
  pcVar2 = index(in_RDI,in_RSI,in_EDX);
  in_RDI->m_rounds[(ulong)pcVar2 & 0xff] = in_RDI->m_rounds[(ulong)pcVar2 & 0xff] + 1;
  pcVar2 = index(in_RDI,__s,__c);
  uVar4 = (ulong)in_RDI->m_rounds[(ulong)pcVar2 & 0xff] % ((ulong)in_RSI & 0xffffffff);
  if ((int)uVar4 == 0) {
    for (local_18 = (char *)0x0; local_18 < (char *)0x4; local_18 = local_18 + 1) {
      index(in_RDI,__s,(int)uVar4);
      nonce(in_stack_ffffffffffffffe0,(size_t)in_RDI);
      uVar1 = Nonce::next((uint8_t)((ulong)in_stack_ffffffffffffffe0 >> 0x38),
                          (uint32_t)in_stack_ffffffffffffffe0,(uint32_t)((ulong)in_RDI >> 0x20));
      __s = local_18;
      puVar3 = nonce(in_stack_ffffffffffffffe0,(size_t)in_RDI);
      *puVar3 = uVar1;
      uVar4 = extraout_RDX;
    }
  }
  else {
    for (this_00 = (WorkerJob<4UL> *)0x0; this_00 < (WorkerJob<4UL> *)0x4;
        this_00 = (WorkerJob<4UL> *)(this_00->m_blobs[0] + 1)) {
      puVar3 = nonce(this_00,(size_t)in_RDI);
      *puVar3 = in_EDX + *puVar3;
    }
  }
  return;
}

Assistant:

inline void nextRound(uint32_t rounds, uint32_t roundSize)
    {
        m_rounds[index()]++;

        if ((m_rounds[index()] % rounds) == 0) {
            for (size_t i = 0; i < N; ++i) {
                *nonce(i) = Nonce::next(index(), *nonce(i), rounds * roundSize);
            }
        }
        else {
            for (size_t i = 0; i < N; ++i) {
                *nonce(i) += roundSize;
            }
        }
    }